

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

tchar_t * tcsncpy_s(tchar_t *Out,size_t OutLen,tchar_t *In,size_t n)

{
  size_t sVar1;
  ulong __n;
  
  if (In != (tchar_t *)0x0) {
    if (OutLen != 0) {
      sVar1 = strlen(In);
      if (sVar1 < n) {
        n = sVar1;
      }
      __n = OutLen - 1;
      if (n < OutLen - 1) {
        __n = n;
      }
      memcpy(Out,In,__n);
      Out[__n] = '\0';
    }
    return Out;
  }
  __assert_fail("In != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/str/str.c"
                ,0x6c,"tchar_t *tcsncpy_s(tchar_t *, size_t, const tchar_t *, size_t)");
}

Assistant:

tchar_t* tcsncpy_s(tchar_t* Out,size_t OutLen,const tchar_t* In,size_t n)
{
    assert(In != NULL);
	if (OutLen>0)
	{
		n = MIN(MIN(tcslen(In),n),OutLen-1);
		memcpy(Out,In,n*sizeof(tchar_t));
		Out[n] = 0;
	}
    return Out;
}